

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::AssertHelper::operator=(AssertHelper *this,Message *message)

{
  undefined1 uVar1;
  UnitTest *this_00;
  UnitTestImpl *this_01;
  long *in_RDI;
  string *in_stack_000000b8;
  string *in_stack_000000c0;
  int in_stack_000000cc;
  char *in_stack_000000d0;
  Type in_stack_000000dc;
  UnitTest *in_stack_000000e0;
  undefined8 in_stack_ffffffffffffff60;
  int skip_count;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar2;
  undefined1 in_stack_ffffffffffffffa0;
  byte bVar3;
  undefined5 in_stack_ffffffffffffffa3;
  Message *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  string local_30 [48];
  
  skip_count = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  UnitTest::GetInstance();
  uVar2 = *(undefined4 *)(*in_RDI + 0x10);
  AppendUserMessage(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  bVar3 = 0;
  uVar1 = anon_unknown_37::ShouldEmitStackTraceForResultType(*(Type *)*in_RDI);
  if ((bool)uVar1) {
    this_00 = UnitTest::GetInstance();
    this_01 = UnitTest::impl(this_00);
    UnitTestImpl::CurrentOsStackTraceExceptTop_abi_cxx11_(this_01,skip_count);
  }
  else {
    std::allocator<char>::allocator();
    bVar3 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT53(in_stack_ffffffffffffffa3,
                        CONCAT12(1,CONCAT11(uVar1,in_stack_ffffffffffffffa0))),(char *)in_RDI,
               (allocator<char> *)CONCAT44(uVar2,in_stack_ffffffffffffff90));
  }
  UnitTest::AddTestPartResult
            (in_stack_000000e0,in_stack_000000dc,in_stack_000000d0,in_stack_000000cc,
             in_stack_000000c0,in_stack_000000b8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  if ((bVar3 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa3);
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void AssertHelper::operator=(const Message& message) const {
  UnitTest::GetInstance()->AddTestPartResult(
      data_->type, data_->file, data_->line,
      AppendUserMessage(data_->message, message),
      ShouldEmitStackTraceForResultType(data_->type)
          ? UnitTest::GetInstance()->impl()->CurrentOsStackTraceExceptTop(1)
          : ""
      // Skips the stack frame for this function itself.
  );  // NOLINT
}